

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRError.h
# Opt level: O3

char * __thiscall MinVR::VRError::what(VRError *this)

{
  char *__dest;
  string emsg;
  string local_58;
  string local_38;
  
  _errorMessage_abi_cxx11_(&local_58,this);
  __dest = (char *)malloc(local_58._M_string_length + 2);
  _errorMessage_abi_cxx11_(&local_38,this);
  strcpy(__dest,local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __dest;
}

Assistant:

virtual const char* what() const throw (){
    std::string emsg = _errorMessage();
    char* out = (char*)malloc(emsg.size() + 2);
    strcpy(out, _errorMessage().c_str());
    return out;
  }